

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

int explist1(LexState *ls,expdesc *v)

{
  int iVar1;
  int iVar2;
  
  expr(ls,v);
  iVar2 = 1;
  while( true ) {
    iVar1 = testnext(ls,0x2c);
    if (iVar1 == 0) break;
    luaK_exp2nextreg(ls->fs,v);
    expr(ls,v);
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int explist1 (LexState *ls, expdesc *v) {
  /* explist1 -> expr { `,' expr } */
  int n = 1;  /* at least one expression */
  expr(ls, v);
  while (testnext(ls, ',')) {
    luaK_exp2nextreg(ls->fs, v);
    expr(ls, v);
    n++;
  }
  return n;
}